

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_MergeSortCost_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  auVar3._8_8_ = (long)pInEnd - (long)pInBeg >> 0x3f;
  auVar3._0_8_ = (long)pInEnd - (long)pInBeg >> 2;
  uVar11 = SUB164(auVar3 / SEXT816(2),0);
  if ((int)uVar11 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                  ,0xba,"void Abc_MergeSortCost_rec(int *, int *, int *)");
  }
  if (uVar11 != 1) {
    if (uVar11 == 2) {
      iVar1 = pInBeg[3];
      if (iVar1 < pInBeg[1]) {
        pInBeg[3] = pInBeg[1];
        pInBeg[1] = iVar1;
        iVar1 = pInBeg[2];
        pInBeg[2] = *pInBeg;
        *pInBeg = iVar1;
      }
    }
    else {
      if (7 < uVar11) {
        piVar5 = pInBeg + (uVar11 & 0x7ffffffe);
        Abc_MergeSortCost_rec(pInBeg,piVar5,pOutBeg);
        Abc_MergeSortCost_rec(piVar5,pInEnd,pOutBeg + (uVar11 & 0x7ffffffe));
        Abc_MergeSortCostMerge(pInBeg,piVar5,piVar5,pInEnd,pOutBeg);
        memcpy(pInBeg,pOutBeg,(ulong)(uVar11 & 0x7fffffff) << 3);
        return;
      }
      piVar5 = pInBeg + 3;
      lVar6 = 1;
      for (uVar7 = 0; uVar7 != uVar11 - 1; uVar7 = uVar7 + 1) {
        lVar8 = 0;
        uVar10 = uVar7;
        while( true ) {
          uVar9 = uVar10 & 0xffffffff;
          uVar4 = (int)uVar10 * 2;
          if ((int)uVar11 <= (int)(lVar6 + lVar8)) break;
          uVar10 = lVar6 + lVar8;
          if (pInBeg[(int)(uVar4 | 1)] <= piVar5[lVar8 * 2]) {
            uVar10 = uVar9;
          }
          lVar8 = lVar8 + 1;
        }
        uVar2 = *(undefined8 *)(pInBeg + uVar7 * 2);
        *(undefined8 *)(pInBeg + uVar7 * 2) = *(undefined8 *)(pInBeg + (int)uVar4);
        *(undefined8 *)(pInBeg + (int)uVar4) = uVar2;
        lVar6 = lVar6 + 1;
        piVar5 = piVar5 + 2;
      }
    }
  }
  return;
}

Assistant:

void Abc_MergeSortCost_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = (pInEnd - pInBeg)/2;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[1] > pInBeg[3] )
         {
             pInBeg[1] ^= pInBeg[3];
             pInBeg[3] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[3];
             pInBeg[0] ^= pInBeg[2];
             pInBeg[2] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[2];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[2*j+1] < pInBeg[2*best_i+1] )
                    best_i = j;
            temp = pInBeg[2*i]; 
            pInBeg[2*i] = pInBeg[2*best_i]; 
            pInBeg[2*best_i] = temp;
            temp = pInBeg[2*i+1]; 
            pInBeg[2*i+1] = pInBeg[2*best_i+1]; 
            pInBeg[2*best_i+1] = temp;
        }
    }
    else
    {
        Abc_MergeSortCost_rec( pInBeg, pInBeg + 2*(nSize/2), pOutBeg );
        Abc_MergeSortCost_rec( pInBeg + 2*(nSize/2), pInEnd, pOutBeg + 2*(nSize/2) );
        Abc_MergeSortCostMerge( pInBeg, pInBeg + 2*(nSize/2), pInBeg + 2*(nSize/2), pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * 2 * nSize );
    }
}